

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O0

int32_t uprv_swapArray64(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                        UErrorCode *pErrorCode)

{
  ulong uVar1;
  UBool UVar2;
  uint64_t x;
  ulong *puStack_48;
  int32_t count;
  uint64_t *q;
  uint64_t *p;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*pErrorCode), UVar2 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if (((ds == (UDataSwapper *)0x0) ||
           (((inData == (void *)0x0 || (length < 0)) || ((length & 7U) != 0)))) ||
          (outData == (void *)0x0)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    ds_local._4_4_ = 0;
  }
  else {
    puStack_48 = (ulong *)outData;
    q = (uint64_t *)inData;
    for (x._4_4_ = length / 8; ds_local._4_4_ = length, 0 < x._4_4_; x._4_4_ = x._4_4_ + -1) {
      uVar1 = *q;
      *puStack_48 = uVar1 << 0x38 | (uVar1 & 0xff00) << 0x28 | (uVar1 & 0xff0000) << 0x18 |
                    (uVar1 & 0xff000000) << 8 | uVar1 >> 8 & 0xff000000 | uVar1 >> 0x18 & 0xff0000 |
                    uVar1 >> 0x28 & 0xff00 | uVar1 >> 0x38;
      puStack_48 = puStack_48 + 1;
      q = q + 1;
    }
  }
  return ds_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
uprv_swapArray64(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    const uint64_t *p;
    uint64_t *q;
    int32_t count;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length&7)!=0 || outData==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    p=(const uint64_t *)inData;
    q=(uint64_t *)outData;
    count=length/8;
    while(count>0) {
        uint64_t x=*p++;
        x=(x<<56)|((x&0xff00)<<40)|((x&0xff0000)<<24)|((x&0xff000000)<<8)|
            ((x>>8)&0xff000000)|((x>>24)&0xff0000)|((x>>40)&0xff00)|(x>>56);
        *q++=x;
        --count;
    }

    return length;
}